

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O3

void __thiscall MockUserCreateForm::clean(MockUserCreateForm *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  char *__end;
  string local_50;
  
  if ((this->firstName)._M_string_length - 0x21 < 0xffffffffffffffe0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"invalid first name length","");
    Form::addError((Form *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((this->lastName)._M_string_length - 0x41 < 0xffffffffffffffc0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"invalid last name length","");
    Form::addError((Form *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((this->email)._M_string_length - 0x41 < 0xffffffffffffffc0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"invalid first name length","");
    Form::addError((Form *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((_Rb_tree_header *)
      Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      BaseUser::getEmail((BaseUser *)&p_Var2[1]._M_parent);
      iVar1 = std::__cxx11::string::compare((char *)&this->email);
      if (iVar1 == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"A user with this email already exists","");
        Form::addError((Form *)this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 !=
             &Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header);
  }
  if ((this->password)._M_string_length - 0x41 < 0xffffffffffffffc0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"invalid password length","");
    Form::addError((Form *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MockUserCreateForm::clean() {

    if (firstName.empty() || firstName.size() > 32) addError("invalid first name length");
    if (lastName.empty() || lastName.size() > 64) addError("invalid last name length");
    if (email.empty() || email.size() > 64) addError("invalid first name length");
    for (auto &it : BaseUser::all()) {
        if (it.second.getEmail() == email) addError("A user with this email already exists");
    }
    if (password.empty() || password.size() > 64) addError("invalid password length");
}